

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O2

bool __thiscall
helics::InputInfo::addData
          (InputInfo *this,GlobalHandle source_id,Time valueTime,uint iteration,
          shared_ptr<const_helics::SmallBuffer> *data)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pGVar1;
  long lVar2;
  long lVar3;
  dataRecord *pdVar4;
  bool bVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pointer pvVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  SmallBuffer *sb1;
  const_iterator __position;
  long lVar10;
  uint local_74;
  TimeRepresentation<count_time<9,_long>_> local_70;
  SmallBuffer *local_68;
  undefined8 local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_58;
  value_type local_50;
  
  local_68 = (data->super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  uVar7 = 0;
  if (local_68 == (SmallBuffer *)0x0) goto LAB_002bb94d;
  pGVar1 = (this->input_sources).
           super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (ulong)((long)(this->input_sources).
                        super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar1) >> 3;
  uVar9 = uVar8 & 0xffffffff;
  if ((int)uVar8 < 1) {
    uVar9 = uVar7;
  }
  lVar2 = 0;
  do {
    lVar10 = lVar2;
    uVar8 = uVar7;
    if (uVar9 * 0x18 - lVar10 == 0) goto LAB_002bb94b;
    uVar7 = uVar8 + 8;
    lVar2 = lVar10 + 0x18;
  } while ((*(int *)((long)&(pGVar1->fed_id).gid + uVar8) != source_id.fed_id.gid.gid) ||
          (*(int *)((long)&(pGVar1->handle).hid + uVar8) != source_id.handle.hid.hid));
  if (*(long *)((long)&((this->deactivated).
                        super__Vector_base<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->internalTimeCode + uVar8) <
      valueTime.internalTimeCode) goto LAB_002bb94b;
  pvVar6 = (this->data_queues).
           super__Vector_base<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = *(long *)((long)&(pvVar6->
                           super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                           )._M_impl.super__Vector_impl_data + lVar10 + 8);
  local_74 = iteration;
  local_70.internalTimeCode = valueTime.internalTimeCode;
  if (*(long *)((long)&(pvVar6->
                       super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                       )._M_impl.super__Vector_impl_data + lVar10) == lVar2) {
    sb1 = *(SmallBuffer **)
           ((long)&(((this->current_data).
                     super__Vector_base<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
           + uVar8 * 2);
    if (sb1 != (SmallBuffer *)0x0) {
      lVar2 = (this->minTimeGap).internalTimeCode;
      if ((0 < lVar2) &&
         (valueTime.internalTimeCode -
          *(long *)((long)&(((this->current_data_time).
                             super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->first).internalTimeCode +
                   uVar8 * 2) < lVar2)) goto LAB_002bb94b;
      if (this->only_update_on_change == true) goto LAB_002bb9c7;
    }
    goto LAB_002bb9de;
  }
  if (*(long *)(lVar2 + -0x20) < valueTime.internalTimeCode) {
    lVar3 = (this->minTimeGap).internalTimeCode;
    if ((0 < lVar3) && (valueTime.internalTimeCode - *(long *)(lVar2 + -0x20) < lVar3)) {
LAB_002bb94b:
      uVar7 = 0;
      goto LAB_002bb94d;
    }
    if (this->only_update_on_change == true) {
      sb1 = *(SmallBuffer **)(lVar2 + -0x10);
LAB_002bb9c7:
      bVar5 = helics::operator==(sb1,local_68);
      if (bVar5) goto LAB_002bb94b;
      pvVar6 = (this->data_queues).
               super__Vector_base<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
LAB_002bb9de:
    std::vector<helics::InputInfo::dataRecord,std::allocator<helics::InputInfo::dataRecord>>::
    emplace_back<TimeRepresentation<count_time<9,long>>&,unsigned_int&,std::shared_ptr<helics::SmallBuffer_const>>
              ((vector<helics::InputInfo::dataRecord,std::allocator<helics::InputInfo::dataRecord>>
                *)((long)&(pvVar6->
                          super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                          )._M_impl.super__Vector_impl_data + lVar10),&local_70,&local_74,data);
  }
  else {
    local_50.data.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (data->super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    (data->super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    (data->super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = &local_50.data.
               super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ;
    local_60 = 0;
    _Stack_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_50.time.internalTimeCode = valueTime.internalTimeCode;
    local_50.iteration = iteration;
    local_50.data.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_68;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_58);
    pvVar6 = (this->data_queues).
             super__Vector_base<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar4 = *(dataRecord **)
              ((long)&(pvVar6->
                      super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                      )._M_impl.super__Vector_impl_data + lVar10);
    uVar7 = *(long *)((long)&(pvVar6->
                             super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                             )._M_impl.super__Vector_impl_data + lVar10 + 8) - (long)pdVar4 >> 5;
    __position._M_current = pdVar4;
    while (uVar9 = uVar7, 0 < (long)uVar9) {
      uVar7 = uVar9 >> 1;
      lVar2 = __position._M_current[uVar7].time.internalTimeCode;
      if ((lVar2 <= valueTime.internalTimeCode) &&
         ((lVar2 != valueTime.internalTimeCode ||
          (__position._M_current[uVar7].iteration <= iteration)))) {
        __position._M_current = __position._M_current + uVar7 + 1;
        uVar7 = ~uVar7 + uVar9;
      }
    }
    if (__position._M_current != pdVar4) {
      lVar2 = (this->minTimeGap).internalTimeCode;
      if ((0 < lVar2) &&
         (local_70.internalTimeCode - __position._M_current[-1].time.internalTimeCode < lVar2)) {
LAB_002bbab1:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
        goto LAB_002bb94b;
      }
      if (this->only_update_on_change == true) {
        bVar5 = helics::operator==(__position._M_current[-1].data.
                                   super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,local_68);
        if (bVar5) goto LAB_002bbab1;
        pvVar6 = (this->data_queues).
                 super__Vector_base<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
    }
    std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>::
    _M_insert_rval((vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                    *)((long)&(pvVar6->
                              super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                              )._M_impl.super__Vector_impl_data + lVar10),__position,&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  }
  uVar7 = 1;
LAB_002bb94d:
  return SUB81(uVar7,0);
}

Assistant:

bool InputInfo::addData(GlobalHandle source_id,
                        Time valueTime,
                        unsigned int iteration,
                        std::shared_ptr<const SmallBuffer> data)
{
    if (!data) {
        return false;
    }
    int index;
    bool found = false;
    for (index = 0; index < static_cast<int>(input_sources.size()); ++index) {
        if (input_sources[index] == source_id) {
            if (valueTime > deactivated[index]) {
                return false;
            }
            found = true;
            break;
        }
    }
    if (!found) {
        return false;
    }
    if (data_queues[index].empty()) {
        if (current_data[index]) {
            if (minTimeGap > timeZero) {
                if ((valueTime - current_data_time[index].first) < minTimeGap) {
                    return false;
                }
            }
            if (only_update_on_change) {
                if (*current_data[index] == *data) {
                    return false;
                }
            }
        }
        data_queues[index].emplace_back(valueTime, iteration, std::move(data));
    } else if (valueTime > data_queues[index].back().time) {
        if (minTimeGap > timeZero) {
            if ((valueTime - data_queues[index].back().time) < minTimeGap) {
                return false;
            }
        }
        if (only_update_on_change) {
            if (*data_queues[index].back().data == *data) {
                return false;
            }
        }
        data_queues[index].emplace_back(valueTime, iteration, std::move(data));
    } else {
        dataRecord newRecord(valueTime, iteration, std::move(data));
        auto m = std::upper_bound(data_queues[index].begin(),
                                  data_queues[index].end(),
                                  newRecord,
                                  recordComparison);
        if (m != data_queues[index].begin()) {
            auto prev = m;
            --prev;
            if (minTimeGap > timeZero) {
                if ((valueTime - prev->time) < minTimeGap) {
                    return false;
                }
            }
            if (only_update_on_change) {
                if (*prev->data == *newRecord.data) {
                    return false;
                }
            }
        }
        data_queues[index].insert(m, std::move(newRecord));
    }
    return true;
}